

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O2

Node __thiscall verona::local_fq(verona *this,Node *node)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Node NVar2;
  undefined1 local_a8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  Lookup l;
  
  local_a8._0_8_ = &l;
  l.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)Class;
  l.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TypeAlias;
  l.bindings._M_t._M_impl._0_8_ = TypeParam;
  l.bindings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = Trait;
  l.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)Function;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5;
  bVar1 = trieste::Token::in(&((node->
                               super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->type_,(initializer_list<trieste::Token> *)local_a8);
  if (!bVar1) {
    l.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)Class;
    l.def.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TypeAlias;
    l.bindings._M_t._M_impl._0_8_ = TypeParam;
    l.bindings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = Trait;
    l.bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)Function;
    trieste::NodeDef::parent
              ((NodeDef *)local_a8,
               (initializer_list<trieste::Token> *)
               (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_a8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  }
  ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 0x10),
             &node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
  Lookup::Lookup(&l,(Node *)(local_a8 + 0x10));
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  make_fq((Lookup *)this,SUB81(&l,0));
  Lookup::~Lookup(&l);
  NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar2.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node local_fq(Node node)
  {
    // Build an FQType for the local type.
    if (!node->in({Class, TypeAlias, TypeParam, Trait, Function}))
      node = node->parent({Class, TypeAlias, TypeParam, Trait, Function});

    Lookup l(node);
    return make_fq(l, true);
  }